

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O1

Float __thiscall
pbrt::BVHLightSampler::PDF(BVHLightSampler *this,LightSampleContext *ctx,LightHandle *light)

{
  Normal3f *pNVar1;
  float fVar2;
  undefined8 uVar3;
  LightBVHNode *pLVar4;
  float fVar5;
  undefined1 auVar6 [16];
  size_t sVar7;
  LightBVHNode **ppLVar8;
  LightBVHNode *pLVar9;
  LightBVHNode *this_00;
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM4 [16];
  Point3f p;
  Point3f p_00;
  Point3f p_01;
  Normal3f n;
  Normal3f n_00;
  array<float,_2> ci;
  float local_58;
  Float FStack_54;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  auVar11 = in_ZMM0._0_16_;
  sVar7 = HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
          ::FindOffset(&this->lightToNode,light);
  if ((this->lightToNode).table.ptr[sVar7].set == false) {
    auVar11 = vcvtusi2ss_avx512f(auVar11,((this->infiniteLights).nStored + 1) -
                                         (ulong)(this->root == (LightBVHNode *)0x0));
    local_4c = 1.0 / auVar11._0_4_;
  }
  else {
    ppLVar8 = HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
              ::operator[](&this->lightToNode,light);
    this_00 = *ppLVar8;
    auVar11._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar11._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar11._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar11._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    uVar3 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
    auVar12._0_4_ = (float)uVar3 + auVar11._0_4_;
    auVar12._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar11._4_4_;
    auVar12._8_4_ = auVar11._8_4_ + 0.0;
    auVar12._12_4_ = auVar11._12_4_ + 0.0;
    auVar6._8_4_ = 0x3f000000;
    auVar6._0_8_ = 0x3f0000003f000000;
    auVar6._12_4_ = 0x3f000000;
    local_38 = vmulps_avx512vl(auVar12,auVar6);
    fVar5 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
            (ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    pNVar1 = &ctx->ns;
    local_48._0_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).x;
    local_48._4_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).y;
    fVar2 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    uStack_40 = 0;
    p.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_38._0_8_;
    p.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
    FVar10 = LightBounds::Importance
                       (&this_00->lightBounds,p,(Normal3f)pNVar1->super_Tuple3<pbrt::Normal3,_float>
                       );
    local_4c = 0.0;
    if ((FVar10 != 0.0) || (NAN(FVar10))) {
      pLVar9 = this_00->parent;
      local_4c = 1.0;
      if (pLVar9 != (LightBVHNode *)0x0) {
        local_4c = 1.0;
        do {
          auVar11 = local_38;
          p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
          p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)local_38._0_4_;
          p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)local_38._4_4_;
          n.super_Tuple3<pbrt::Normal3,_float>.z = fVar2;
          n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_48;
          n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_48._4_4_;
          local_38 = auVar11;
          local_50 = LightBounds::Importance(&(pLVar9->field_2).children[0]->lightBounds,p_00,n);
          auVar11 = local_38;
          p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
          p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)local_38._0_4_;
          p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)local_38._4_4_;
          n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar2;
          n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_48;
          n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_48._4_4_;
          local_38 = auVar11;
          FVar10 = LightBounds::Importance
                             (&(this_00->parent->field_2).children[1]->lightBounds,p_01,n_00);
          _local_58 = CONCAT44(FVar10,local_50);
          pLVar4 = this_00->parent;
          local_4c = local_4c *
                     ((&local_58)[this_00 == *(LightBVHNode **)((long)&pLVar4->field_2 + 8)] /
                     (local_50 + FVar10));
          pLVar9 = pLVar4->parent;
          this_00 = pLVar4;
        } while (pLVar9 != (LightBVHNode *)0x0);
      }
      sVar7 = (this->infiniteLights).nStored;
      auVar11 = vcvtusi2ss_avx512f(in_XMM4,sVar7);
      auVar6 = vcvtusi2ss_avx512f(in_XMM4,sVar7 + 1);
      local_4c = local_4c * (1.0 - auVar11._0_4_ / auVar6._0_4_);
    }
  }
  return local_4c;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const LightSampleContext &ctx, LightHandle light) const {
        if (!lightToNode.HasKey(light))
            return 1.f / (infiniteLights.size() + (root != nullptr ? 1 : 0));

        LightBVHNode *node = lightToNode[light];
        Float pdf = 1;

        Point3f p = ctx.p();
        Normal3f n = ctx.ns;
        if (node->lightBounds.Importance(p, n) == 0)
            return 0;

        for (; node->parent != nullptr; node = node->parent) {
            pstd::array<Float, 2> ci = {
                node->parent->children[0]->lightBounds.Importance(p, n),
                node->parent->children[1]->lightBounds.Importance(p, n)};
            int childIndex = static_cast<int>(node == node->parent->children[1]);
            DCHECK_GT(ci[childIndex], 0);
            pdf *= ci[childIndex] / (ci[0] + ci[1]);
        }

        Float pInfinite = Float(infiniteLights.size()) / Float(infiniteLights.size() + 1);
        return pdf * (1.f - pInfinite);
    }